

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O3

int CVmObjFileName::call_stat_prop(vm_val_t *result,uchar **pc_ptr,uint *argc,vm_prop_id_t prop)

{
  int iVar1;
  
  iVar1 = CVmMetaTable::prop_to_vector_idx(G_meta_table_X,metaclass_reg_->meta_reg_idx_,prop);
  if (iVar1 == 9) {
    s_getp_getRootDirs(result,argc);
  }
  else {
    if (iVar1 != 4) {
      iVar1 = CVmObject::call_stat_prop(result,pc_ptr,argc,prop);
      return iVar1;
    }
    s_getp_fromUniversal(result,argc);
  }
  return 1;
}

Assistant:

int CVmObjFileName::call_stat_prop(VMG_ vm_val_t *result,
                                   const uchar **pc_ptr, uint *argc,
                                   vm_prop_id_t prop)
{
    /* look up the function */
    uint midx = G_meta_table
                ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    switch (midx)
    {
    case VMOFN_FROMUNIVERSAL:
        return s_getp_fromUniversal(vmg_ result, argc);

    case VMOFN_GETROOTDIRS:
        return s_getp_getRootDirs(vmg_ result, argc);

    default:
        /* it's not ours - inherit the default handling */
        return CVmObject::call_stat_prop(vmg_ result, pc_ptr, argc, prop);
    }
}